

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void opj_j2k_write_poc_in_memory
               (opj_j2k_t *p_j2k,OPJ_BYTE *p_data,OPJ_UINT32 *p_data_written,
               opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint uVar2;
  opj_tcp_t *poVar3;
  opj_tccp_t *poVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  opj_poc_t *poVar7;
  int iVar8;
  int iVar9;
  OPJ_BYTE *p_buffer;
  uint p_nb_bytes;
  OPJ_BYTE *p_buffer_00;
  bool bVar10;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xcf0,
                  "void opj_j2k_write_poc_in_memory(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    poVar3 = (p_j2k->m_cp).tcps;
    uVar1 = p_j2k->m_current_tile_number;
    poVar7 = poVar3[uVar1].pocs;
    poVar4 = poVar3[uVar1].tccps;
    uVar2 = p_j2k->m_private_image->numcomps;
    iVar8 = poVar3[uVar1].numpocs + 1;
    p_nb_bytes = 2 - (uVar2 < 0x101);
    iVar9 = (p_nb_bytes * 2 + 5) * iVar8;
    opj_write_bytes_LE(p_data,0xff5f,2);
    opj_write_bytes_LE(p_data + 2,iVar9 + 2,2);
    p_buffer_00 = p_data + 4;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      opj_write_bytes_LE(p_buffer_00,poVar7->resno0,1);
      opj_write_bytes_LE(p_buffer_00 + 1,poVar7->compno0,p_nb_bytes);
      p_buffer = p_buffer_00 + (ulong)p_nb_bytes + 1;
      opj_write_bytes_LE(p_buffer,poVar7->layno1,2);
      opj_write_bytes_LE(p_buffer_00 + (ulong)p_nb_bytes + 3,poVar7->resno1,1);
      opj_write_bytes_LE(p_buffer_00 + (ulong)p_nb_bytes + 4,poVar7->compno1,p_nb_bytes);
      opj_write_bytes_LE(p_buffer + (ulong)p_nb_bytes + 3,poVar7->prg,1);
      OVar5 = poVar3[uVar1].numlayers;
      if ((int)poVar7->layno1 < (int)poVar3[uVar1].numlayers) {
        OVar5 = poVar7->layno1;
      }
      poVar7->layno1 = OVar5;
      OVar5 = poVar4->numresolutions;
      if ((int)poVar7->resno1 < (int)OVar5) {
        OVar5 = poVar7->resno1;
      }
      poVar7->resno1 = OVar5;
      uVar6 = poVar7->compno1;
      if ((int)uVar2 <= (int)poVar7->compno1) {
        uVar6 = uVar2;
      }
      poVar7->compno1 = uVar6;
      poVar7 = poVar7 + 1;
      p_buffer_00 = p_buffer + (ulong)p_nb_bytes + 4;
    }
    *p_data_written = iVar9 + 4;
    return;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xcf1,
                "void opj_j2k_write_poc_in_memory(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
               );
}

Assistant:

static void opj_j2k_write_poc_in_memory(opj_j2k_t *p_j2k,
                                        OPJ_BYTE * p_data,
                                        OPJ_UINT32 * p_data_written,
                                        opj_event_mgr_t * p_manager
                                       )
{
    OPJ_UINT32 i;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_nb_comp;
    OPJ_UINT32 l_nb_poc;
    OPJ_UINT32 l_poc_size;
    opj_image_t *l_image = 00;
    opj_tcp_t *l_tcp = 00;
    opj_tccp_t *l_tccp = 00;
    opj_poc_t *l_current_poc = 00;
    OPJ_UINT32 l_poc_room;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_manager);

    l_tcp = &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number];
    l_tccp = &l_tcp->tccps[0];
    l_image = p_j2k->m_private_image;
    l_nb_comp = l_image->numcomps;
    l_nb_poc = 1 + l_tcp->numpocs;

    if (l_nb_comp <= 256) {
        l_poc_room = 1;
    } else {
        l_poc_room = 2;
    }

    l_poc_size = 4 + (5 + 2 * l_poc_room) * l_nb_poc;

    l_current_data = p_data;

    opj_write_bytes(l_current_data, J2K_MS_POC,
                    2);                                   /* POC  */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_poc_size - 2,
                    2);                                 /* Lpoc */
    l_current_data += 2;

    l_current_poc =  l_tcp->pocs;
    for (i = 0; i < l_nb_poc; ++i) {
        opj_write_bytes(l_current_data, l_current_poc->resno0,
                        1);                                /* RSpoc_i */
        ++l_current_data;

        opj_write_bytes(l_current_data, l_current_poc->compno0,
                        l_poc_room);              /* CSpoc_i */
        l_current_data += l_poc_room;

        opj_write_bytes(l_current_data, l_current_poc->layno1,
                        2);                                /* LYEpoc_i */
        l_current_data += 2;

        opj_write_bytes(l_current_data, l_current_poc->resno1,
                        1);                                /* REpoc_i */
        ++l_current_data;

        opj_write_bytes(l_current_data, l_current_poc->compno1,
                        l_poc_room);              /* CEpoc_i */
        l_current_data += l_poc_room;

        opj_write_bytes(l_current_data, (OPJ_UINT32)l_current_poc->prg,
                        1);   /* Ppoc_i */
        ++l_current_data;

        /* change the value of the max layer according to the actual number of layers in the file, components and resolutions*/
        l_current_poc->layno1 = (OPJ_UINT32)opj_int_min((OPJ_INT32)
                                l_current_poc->layno1, (OPJ_INT32)l_tcp->numlayers);
        l_current_poc->resno1 = (OPJ_UINT32)opj_int_min((OPJ_INT32)
                                l_current_poc->resno1, (OPJ_INT32)l_tccp->numresolutions);
        l_current_poc->compno1 = (OPJ_UINT32)opj_int_min((OPJ_INT32)
                                 l_current_poc->compno1, (OPJ_INT32)l_nb_comp);

        ++l_current_poc;
    }

    *p_data_written = l_poc_size;
}